

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

WeakPtr __thiscall
hwnet::util::TimerRoutine::
addTimerOnce<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPConnector>),std::shared_ptr<hwnet::TCPConnector>&>
          (TimerRoutine *this,milliseconds timeout,
          _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *callback,
          shared_ptr<hwnet::TCPConnector> *args)

{
  int *piVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __p;
  int iVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined8 *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  WeakPtr WVar6;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *local_58;
  undefined1 local_50 [8];
  Ptr timer;
  _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *local_38;
  milliseconds timeout_local;
  
  local_38 = callback;
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_58 = local_38 + (lVar4 - *(long *)(timeout + 0xb0)) / 1000000;
  uVar2 = *in_R8;
  lVar4 = in_R8[1];
  if (lVar4 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
    }
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  __p = timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(shared_ptr<hwnet::TCPConnector> **)local_78._M_unused._0_8_ = args;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = uVar2;
  *(long *)((long)local_78._M_unused._0_8_ + 0x10) = lVar4;
  pcStack_60 = std::
               _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<hwnet::TCPConnector>))(const_std::shared_ptr<hwnet::util::Timer>_&,_std::shared_ptr<hwnet::TCPConnector>)>_>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<hwnet::TCPConnector>))(const_std::shared_ptr<hwnet::util::Timer>_&,_std::shared_ptr<hwnet::TCPConnector>)>_>
             ::_M_manager;
  Timer::Timer((Timer *)timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,(milliseconds *)&local_58,(milliseconds *)&local_38,true,
               (Callback *)&local_78);
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            ((__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_50,
             (Timer *)__p._M_pi);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(timeout + 0x18));
  if (iVar3 == 0) {
    TimerMgr::insert((TimerMgr *)timeout,(Ptr *)local_50);
    if ((*(char *)(timeout + 0xc0) == '\x01') &&
       (local_38 <
        *(_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> **)
         (timeout + 0xb8))) {
      *(_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> **)
       (timeout + 0xb8) = local_38;
      std::_V2::condition_variable_any::notify_one((condition_variable_any *)(timeout + 0x60));
    }
    (this->mgr).empty_element_ptr.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_50;
    (this->mgr).empty_element_ptr.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&((timer.
                                  super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_enable_shared_from_this<hwnet::util::Timer>).
                                _M_weak_this.
                                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      else {
        piVar1 = (int *)((long)&((timer.
                                  super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_enable_shared_from_this<hwnet::util::Timer>).
                                _M_weak_this.
                                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(timeout + 0x18));
    _Var5._M_pi = extraout_RDX;
    if (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var5._M_pi = extraout_RDX_00;
    }
    WVar6.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    WVar6.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (WeakPtr)WVar6.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

Timer::WeakPtr addTimerOnce(milliseconds timeout, F&& callback, TArgs&& ...args)
    {
        auto timer = Timer::Ptr(new Timer(getMilliseconds() + timeout,timeout,
        	true,std::bind(std::forward<F>(callback), std::placeholders::_1, std::forward<TArgs>(args)...)));

        std::lock_guard<std::mutex> guard(this->mgr.mtx);
        this->mgr.insert(timer);
        if(waitting && timeout < waitTime) {
        	waitTime = timeout;
        	this->cv.notify_one();
        }

        return timer;
    }